

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void juzzlin::SimpleLogger::initialize(string *filename,bool append)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)filename);
  Impl::initialize(&local_30,append);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SimpleLogger::initialize(std::string filename, bool append)
{
    Impl::initialize(filename, append);
}